

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::ClCommandLine::add<char_const*>(ClCommandLine *this,string *s,char *strs)

{
  allocator local_39;
  value_type local_38;
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(this + 0x10),s);
  std::__cxx11::string::string((string *)&local_38,strs,&local_39);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(this + 0x10),&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void add (std::string const & s, Strs... strs) {
            strings_.push_back (s);
            this->add (strs...);
        }